

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::DoubleParameter::MergeFrom(DoubleParameter *this,DoubleParameter *from)

{
  double dVar1;
  void *pvVar2;
  LogMessage *other;
  DoubleRange *pDVar3;
  DoubleRange *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/Parameters.pb.cc"
               ,0x2c6);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  dVar1 = from->defaultvalue_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->defaultvalue_ = dVar1;
  }
  if (from->_oneof_case_[0] == 10) {
    if (this->_oneof_case_[0] != 10) {
      this->_oneof_case_[0] = 10;
      pDVar3 = (DoubleRange *)operator_new(0x28);
      DoubleRange::DoubleRange(pDVar3);
      (this->AllowedValues_).range_ = pDVar3;
    }
    pDVar3 = (this->AllowedValues_).range_;
    if (from->_oneof_case_[0] == 10) {
      from_00 = (from->AllowedValues_).range_;
    }
    else {
      from_00 = DoubleRange::default_instance();
    }
    DoubleRange::MergeFrom(pDVar3,from_00);
  }
  return;
}

Assistant:

void DoubleParameter::MergeFrom(const DoubleParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.DoubleParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.defaultvalue() != 0) {
    set_defaultvalue(from.defaultvalue());
  }
  switch (from.AllowedValues_case()) {
    case kRange: {
      mutable_range()->::CoreML::Specification::DoubleRange::MergeFrom(from.range());
      break;
    }
    case ALLOWEDVALUES_NOT_SET: {
      break;
    }
  }
}